

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O0

size_t Assimp::Write<aiVector3t<float>>(IOStream *stream,aiVector3D *v)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t t;
  aiVector3D *v_local;
  IOStream *stream_local;
  
  sVar1 = Write<float>(stream,&v->x);
  sVar2 = Write<float>(stream,&v->y);
  sVar3 = Write<float>(stream,&v->z);
  return sVar3 + sVar2 + sVar1;
}

Assistant:

inline
size_t Write<aiVector3D>(IOStream * stream, const aiVector3D& v) {
    size_t t = Write<float>(stream,v.x);
    t += Write<float>(stream,v.y);
    t += Write<float>(stream,v.z);

    return t;
}